

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::use_default_present_mode_selection(SwapchainBuilder *this)

{
  SwapchainBuilder *this_local;
  
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::clear
            (&(this->info).desired_present_modes);
  add_desired_present_modes(this,&(this->info).desired_present_modes);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::use_default_present_mode_selection() {
    info.desired_present_modes.clear();
    add_desired_present_modes(info.desired_present_modes);
    return *this;
}